

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgram.cpp
# Opt level: O0

int __thiscall zmq::dgram_t::xrecv(dgram_t *this,msg_t *msg_)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  int *piVar4;
  char *in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  long in_RDI;
  char *errstr_1;
  char *errstr;
  int rc;
  int local_4;
  
  ctx = in_RSI;
  iVar1 = msg_t::close((msg_t *)in_RSI,(int)in_RSI);
  __buf = extraout_RDX;
  if (iVar1 != 0) {
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    ctx = (EVP_PKEY_CTX *)0x258315;
    in_RCX = 
    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dgram.cpp"
    ;
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dgram.cpp"
            ,0x8c);
    fflush(_stderr);
    zmq_abort((char *)0x226529);
    __buf = extraout_RDX_00;
  }
  if ((*(long *)(in_RDI + 0x6e8) == 0) ||
     (ctx = in_RSI,
     uVar2 = pipe_t::read(*(pipe_t **)(in_RDI + 0x6e8),(int)in_RSI,__buf,(size_t)in_RCX),
     (uVar2 & 1) == 0)) {
    iVar1 = msg_t::init((msg_t *)in_RSI,ctx);
    if (iVar1 != 0) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dgram.cpp"
              ,0x91);
      fflush(_stderr);
      zmq_abort((char *)0x2265c8);
    }
    piVar4 = __errno_location();
    *piVar4 = 0xb;
    local_4 = -1;
  }
  else {
    *(undefined8 *)(in_RDI + 0x6f0) = *(undefined8 *)(in_RDI + 0x6e8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::dgram_t::xrecv (msg_t *msg_)
{
    //  Deallocate old content of the message.
    int rc = msg_->close ();
    errno_assert (rc == 0);

    if (!_pipe || !_pipe->read (msg_)) {
        //  Initialise the output parameter to be a 0-byte message.
        rc = msg_->init ();
        errno_assert (rc == 0);

        errno = EAGAIN;
        return -1;
    }
    _last_in = _pipe;

    return 0;
}